

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O2

int __thiscall
yactfr::internal::PseudoVarType::clone
          (PseudoVarType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined1 auStack_38 [8];
  undefined1 local_30 [8];
  PseudoNamedDts local_28;
  
  _clonePseudoOpts((PseudoNamedDts *)(local_30 + 8),(PseudoVarType *)__fn);
  tryCloneAttrs((MapItem *)auStack_38);
  std::
  make_unique<yactfr::internal::PseudoVarType,boost::optional<yactfr::internal::PseudoDataLoc>const&,std::vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,std::default_delete<yactfr::internal::PseudoNamedDt>>,std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,std::default_delete<yactfr::internal::PseudoNamedDt>>>>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,yactfr::TextLocation_const&>
            ((optional<yactfr::internal::PseudoDataLoc> *)(auStack_38 + 8),
             (vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
              *)(__fn + 0x50),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (local_30 + 8),(TextLocation *)auStack_38);
  (this->super_PseudoDt)._vptr_PseudoDt = (_func_int **)local_30;
  local_30 = (undefined1  [8])0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             auStack_38);
  std::
  vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
  ::~vector((vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
             *)(local_30 + 8));
  return (int)this;
}

Assistant:

PseudoDt::Up PseudoVarType::clone() const
{
   return std::make_unique<PseudoVarType>(_pseudoSelLoc, this->_clonePseudoOpts(),
                                          tryCloneAttrs(this->attrs()), this->loc());
}